

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O3

bool clusterG(TSimilarityMap *sim,TKeyPressCollection *keyPresses)

{
  pointer pvVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer psVar7;
  undefined1 (*pauVar8) [16];
  undefined1 auVar9 [16];
  int q;
  int iVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  TClusterId *pTVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  long lVar17;
  undefined1 (*pauVar18) [16];
  undefined8 *puVar19;
  undefined1 (*pauVar20) [16];
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  undefined1 (*pauVar25) [16];
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  bool bVar31;
  double dVar32;
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  
  auVar9 = _DAT_00115030;
  psVar7 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar28 = ((long)(keyPresses->
                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4) *
           -0x5555555555555555;
  uVar27 = (uint)uVar28;
  if ((int)uVar27 < 1) {
    pauVar12 = (undefined1 (*) [16])0x0;
    pauVar22 = (undefined1 (*) [16])0x0;
    pauVar23 = (undefined1 (*) [16])0x0;
  }
  else {
    uVar15 = (ulong)(uVar27 + 1 & 0xfffffffe);
    lVar17 = (ulong)(uVar27 & 0x7fffffff) - 1;
    auVar33._8_4_ = (int)lVar17;
    auVar33._0_8_ = lVar17;
    auVar33._12_4_ = (int)((ulong)lVar17 >> 0x20);
    pTVar14 = &psVar7[1].cid;
    auVar33 = auVar33 ^ _DAT_00115030;
    auVar35 = _DAT_00115020;
    do {
      auVar37 = auVar35 ^ auVar9;
      lVar17 = auVar35._8_8_;
      if ((bool)(~(auVar37._4_4_ == auVar33._4_4_ && auVar33._0_4_ < auVar37._0_4_ ||
                  auVar33._4_4_ < auVar37._4_4_) & 1)) {
        pTVar14[-0xc] = (int)(auVar35._0_8_ + 1);
      }
      if ((auVar37._12_4_ != auVar33._12_4_ || auVar37._8_4_ <= auVar33._8_4_) &&
          auVar37._12_4_ <= auVar33._12_4_) {
        *pTVar14 = (TClusterId)(lVar17 + 1);
      }
      auVar35._0_8_ = auVar35._0_8_ + 2;
      auVar35._8_8_ = lVar17 + 2;
      pTVar14 = pTVar14 + 0x18;
      uVar15 = uVar15 - 2;
    } while (uVar15 != 0);
    pauVar12 = (undefined1 (*) [16])0x0;
    pauVar22 = (undefined1 (*) [16])0x0;
    pauVar23 = (undefined1 (*) [16])0x0;
    if (uVar27 != 1) {
      uVar29 = 1;
      pauVar12 = (undefined1 (*) [16])0x0;
      pauVar22 = (undefined1 (*) [16])0x0;
      pauVar23 = (undefined1 (*) [16])0x0;
      uVar15 = 0;
      do {
        uVar11 = uVar15 + 1;
        pauVar20 = pauVar12;
        uVar30 = uVar29;
        do {
          uVar2 = *(undefined8 *)
                   (*(long *)&(sim->
                              super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[uVar15].
                              super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                              super__Vector_impl_data + uVar30 * 0x10);
          if (pauVar22 == pauVar23) {
            uVar26 = (long)pauVar22 - (long)pauVar20;
            if (uVar26 == 0x7ffffffffffffff0) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar13 = (long)uVar26 >> 4;
            uVar24 = uVar13;
            if (pauVar22 == pauVar20) {
              uVar24 = 1;
            }
            uVar21 = uVar24 + uVar13;
            if (0x7fffffffffffffe < uVar21) {
              uVar21 = 0x7ffffffffffffff;
            }
            if (CARRY8(uVar24,uVar13)) {
              uVar21 = 0x7ffffffffffffff;
            }
            pauVar12 = (undefined1 (*) [16])operator_new(uVar21 * 0x10);
            *(int *)((long)pauVar12 + uVar26) = (int)uVar15;
            *(int *)((long)pauVar12 + uVar26 + 4) = (int)uVar30;
            *(undefined8 *)((long)pauVar12 + uVar26 + 8) = uVar2;
            pauVar25 = pauVar12;
            for (pauVar23 = pauVar20; pauVar22 != pauVar23; pauVar23 = pauVar23 + 1) {
              uVar2 = *(undefined8 *)(*pauVar23 + 8);
              *(undefined8 *)*pauVar25 = *(undefined8 *)*pauVar23;
              *(undefined8 *)(*pauVar25 + 8) = uVar2;
              pauVar25 = pauVar25 + 1;
            }
            if (pauVar20 != (undefined1 (*) [16])0x0) {
              operator_delete(pauVar20,uVar26);
            }
            pauVar23 = pauVar12 + uVar21;
          }
          else {
            *(int *)*pauVar22 = (int)uVar15;
            *(int *)(*pauVar22 + 4) = (int)uVar30;
            *(undefined8 *)(*pauVar22 + 8) = uVar2;
            pauVar12 = pauVar20;
            pauVar25 = pauVar22;
          }
          pauVar22 = pauVar25 + 1;
          uVar30 = uVar30 + 1;
          pauVar20 = pauVar12;
        } while (uVar30 != (uVar27 & 0x7fffffff));
        uVar29 = uVar29 + 1;
        uVar15 = uVar11;
      } while (uVar11 != uVar27 - 1);
      if (pauVar12 != pauVar22) {
        uVar15 = (long)pauVar22 - (long)pauVar12 >> 4;
        lVar17 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (pauVar12,pauVar22,((uint)lVar17 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)pauVar22 - (long)pauVar12 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pauVar12,pauVar22);
        }
        else {
          pauVar20 = pauVar12 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pauVar12,pauVar20);
          if (pauVar20 != pauVar22) {
            do {
              uVar2 = *(undefined8 *)*pauVar20;
              dVar32 = *(double *)(*pauVar20 + 8);
              pauVar16 = pauVar20;
              pauVar18 = pauVar20;
              if (*(double *)(pauVar20[-1] + 8) <= dVar32 && dVar32 != *(double *)(pauVar20[-1] + 8)
                 ) {
                do {
                  pauVar16 = pauVar18 + -1;
                  *pauVar18 = pauVar18[-1];
                  pauVar8 = pauVar18 + -2;
                  pauVar18 = pauVar16;
                } while (*(double *)(*pauVar8 + 8) <= dVar32 && dVar32 != *(double *)(*pauVar8 + 8))
                ;
              }
              *(undefined8 *)*pauVar16 = uVar2;
              *(double *)(*pauVar16 + 8) = dVar32;
              bVar31 = pauVar20 != pauVar25;
              pauVar20 = pauVar20 + 1;
            } while (bVar31);
          }
        }
      }
    }
  }
  puts("[+] Top 10 pairs");
  puVar19 = (undefined8 *)(*pauVar12 + 8);
  uVar15 = 0;
  do {
    printf("    Pair %d: %d %d %g\n",*puVar19,uVar15 & 0xffffffff,(ulong)*(uint *)(puVar19 + -1),
           (ulong)*(uint *)((long)puVar19 + -4));
    uVar15 = uVar15 + 1;
    puVar19 = puVar19 + 2;
  } while (uVar15 != 10);
  uVar15 = (ulong)((long)pauVar22 - (long)pauVar12) >> 4;
  if (0 < (int)uVar15) {
    uVar28 = uVar28 & 0x7fffffff;
    uVar29 = 0;
    do {
      if (*(double *)(pauVar12[uVar29] + 8) <= 0.5 && *(double *)(pauVar12[uVar29] + 8) != 0.5)
      goto LAB_0010c202;
      pauVar22 = pauVar12 + uVar29;
      psVar7 = (keyPresses->
               super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
               super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar3 = psVar7[*(int *)*pauVar22].cid;
      iVar4 = psVar7[*(int *)(*pauVar22 + 4)].cid;
      if (iVar3 != iVar4) {
        iVar10 = iVar3;
        if (iVar4 < iVar3) {
          iVar10 = iVar4;
        }
        if ((int)uVar27 < 1) {
          uVar26 = 0;
          dVar34 = 0.0;
          uVar11 = 0;
          uVar30 = 0;
          dVar32 = NAN;
          dVar36 = 0.0;
        }
        else {
          uVar24 = 0;
          dVar36 = 0.0;
          dVar34 = 0.0;
          dVar32 = 0.0;
          uVar30 = 0;
          uVar11 = 0;
          uVar26 = 0;
          do {
            pvVar1 = (sim->
                     super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar24;
            iVar5 = psVar7[uVar24].cid;
            lVar17 = 0;
            uVar13 = 0;
            pTVar14 = &psVar7->cid;
            do {
              if (uVar24 != uVar13) {
                iVar6 = *pTVar14;
                if ((iVar5 == iVar4 || iVar5 == iVar3) && ((iVar6 == iVar3 || (iVar6 == iVar4)))) {
                  dVar32 = dVar32 + *(double *)
                                     (*(long *)&(pvVar1->
                                                super__Vector_base<stMatch,_std::allocator<stMatch>_>
                                                )._M_impl.super__Vector_impl_data + lVar17);
                  uVar26 = (ulong)((int)uVar26 + 1);
                }
                if (iVar6 == iVar3 && iVar5 == iVar3) {
                  dVar34 = dVar34 + *(double *)
                                     (*(long *)&(pvVar1->
                                                super__Vector_base<stMatch,_std::allocator<stMatch>_>
                                                )._M_impl.super__Vector_impl_data + lVar17);
                  uVar11 = (ulong)((int)uVar11 + 1);
                }
                if (iVar6 == iVar4 && iVar5 == iVar4) {
                  dVar36 = dVar36 + *(double *)
                                     (*(long *)&(pvVar1->
                                                super__Vector_base<stMatch,_std::allocator<stMatch>_>
                                                )._M_impl.super__Vector_impl_data + lVar17);
                  uVar30 = (ulong)((int)uVar30 + 1);
                }
              }
              uVar13 = uVar13 + 1;
              lVar17 = lVar17 + 0x10;
              pTVar14 = pTVar14 + 0xc;
            } while (uVar28 != uVar13);
            uVar24 = uVar24 + 1;
          } while (uVar24 != uVar28);
          if (0 < (int)uVar11) {
            dVar34 = dVar34 / (double)(int)uVar11;
          }
          dVar32 = dVar32 / (double)(int)uVar26;
          if (0 < (int)uVar30) {
            dVar36 = dVar36 / (double)(int)uVar30;
          }
        }
        printf("Merge avg n = %4d, cc = %8.5f, ni = %4d, cci = %8.5f, nj = %4d, ccj = %8.5f\n",
               uVar26,uVar11,uVar30);
        if ((dVar34 + dVar36) * 0.4 < dVar32) {
          if ((int)uVar27 < 1) {
            printf("Clusters %3d %5.4f:",*(undefined8 *)(*pauVar22 + 8));
          }
          else {
            pTVar14 = &((keyPresses->
                        super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ).
                        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->cid;
            uVar30 = uVar28;
            do {
              if ((*pTVar14 == iVar3) || (*pTVar14 == iVar4)) {
                *pTVar14 = iVar10;
              }
              pTVar14 = pTVar14 + 0xc;
              uVar30 = uVar30 - 1;
            } while (uVar30 != 0);
            printf("Clusters %3d %5.4f:",*(undefined8 *)(*pauVar22 + 8));
            if (0 < (int)uVar27) {
              lVar17 = 0x20;
              uVar30 = uVar28;
              do {
                printf(" %3d",(ulong)*(uint *)((long)&(((keyPresses->
                                                                                                                
                                                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                  ).
                                                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  waveform).samples + lVar17));
                lVar17 = lVar17 + 0x30;
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
            }
          }
          putchar(10);
        }
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != (uVar15 & 0x7fffffff));
    if (pauVar12 == (undefined1 (*) [16])0x0) {
      return true;
    }
  }
LAB_0010c202:
  operator_delete(pauVar12,(long)pauVar23 - (long)pauVar12);
  return true;
}

Assistant:

bool clusterG(const TSimilarityMap & sim, TKeyPressCollection & keyPresses) {
    struct Pair {
        int i = -1;
        int j = -1;
        TValueCC cc = -1.0;

        bool operator < (const Pair & a) const { return cc > a.cc; }
    };

    int n = keyPresses.size();

    int nclusters = 0;
    for (int i = 0; i < n; ++i) {
        auto & ci = keyPresses[i].cid;

        ci = i + 1;
        ++nclusters;
    }

    std::vector<Pair> ccpairs;
    for (int i = 0; i < n - 1; ++i) {
        for (int j = i + 1; j < n; ++j) {
            auto & cc = sim[i][j].cc;

            ccpairs.emplace_back(Pair{i, j, cc});
        }
    }

    std::sort(ccpairs.begin(), ccpairs.end());

    printf("[+] Top 10 pairs\n");
    for (int i = 0; i < 10; ++i) {
        printf("    Pair %d: %d %d %g\n", i, ccpairs[i].i, ccpairs[i].j, ccpairs[i].cc);
    }

    int npairs = ccpairs.size();
    for (int ip = 0; ip < npairs; ++ip) {
        auto & curpair = ccpairs[ip];
        //if (frand() > curpair.cc) continue;
        if (curpair.cc < 0.50) break;

        auto ci = keyPresses[curpair.i].cid;
        auto cj = keyPresses[curpair.j].cid;

        if (ci == cj) continue;
        auto cnew = std::min(ci, cj);
        int nsum = 0;
        int nsumi = 0;
        int nsumj = 0;
        double sumcc = 0.0;
        double sumcci = 0.0;
        double sumccj = 0.0;
        for (int k = 0; k < n; ++k) {
            auto ck = keyPresses[k].cid;

            for (int q = 0; q < n; ++q) {
                if (q == k) continue;
                auto cq = keyPresses[q].cid;

                if ((ck == ci || ck == cj) && (cq == ci || cq == cj)) {
                    auto & cc     = sim[k][q].cc;
                    //auto & offset = sim[k][q].offset;

                    sumcc += cc;
                    ++nsum;
                }
                if (ck == ci && cq == ci) {
                    auto & cc     = sim[k][q].cc;
                    //auto & offset = sim[k][q].offset;

                    sumcci += cc;
                    ++nsumi;
                }
                if (ck == cj && cq == cj) {
                    auto & cc     = sim[k][q].cc;
                    //auto & offset = sim[k][q].offset;

                    sumccj += cc;
                    ++nsumj;
                }
            }
        }
        sumcc /= nsum;
        if (nsumi > 0) sumcci /= nsumi;
        if (nsumj > 0) sumccj /= nsumj;
        printf("Merge avg n = %4d, cc = %8.5f, ni = %4d, cci = %8.5f, nj = %4d, ccj = %8.5f\n", nsum, sumcc, nsumi, sumcci, nsumj, sumccj);

        //if (sumcc < 1.000*curpair.cc) continue;
        //if (sumcc > 0.75*sumccj && sumcc > 0.75*sumcci) {
        if (sumcc > 0.4*(sumcci + sumccj)) {
        } else {
            continue;
        }

        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            if (ck == ci || ck == cj) ck = cnew;
        }
        --nclusters;

        printf("Clusters %3d %5.4f:", nclusters, curpair.cc);
        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            printf(" %3d", ck);
        }
        printf("\n");
    }

    return true;
}